

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O3

Result<wasm::HeapType> *
wasm::WATParser::anon_unknown_11::
heaptype<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
          (Result<wasm::HeapType> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  ParseInput *this;
  undefined8 *puVar1;
  bool bVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined7 extraout_var_04;
  undefined7 extraout_var_05;
  Result<wasm::HeapType> *extraout_RAX;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  string_view expected_04;
  string_view expected_05;
  undefined1 local_90 [8];
  Result<wasm::HeapType> type;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [8];
  Result<wasm::HeapType> _val;
  Result<wasm::HeapType> *pRVar3;
  
  this = &ctx->in;
  expected._M_str = "func";
  expected._M_len = 4;
  bVar2 = ParseInput::takeKeyword(this,expected);
  pRVar3 = (Result<wasm::HeapType> *)CONCAT71(extraout_var,bVar2);
  if (bVar2) {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> = 1;
  }
  else {
    expected_00._M_str = "any";
    expected_00._M_len = 3;
    bVar2 = ParseInput::takeKeyword(this,expected_00);
    pRVar3 = (Result<wasm::HeapType> *)CONCAT71(extraout_var_00,bVar2);
    if (bVar2) {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> = 2;
    }
    else {
      expected_01._M_str = "extern";
      expected_01._M_len = 6;
      bVar2 = ParseInput::takeKeyword(this,expected_01);
      pRVar3 = (Result<wasm::HeapType> *)CONCAT71(extraout_var_01,bVar2);
      if (bVar2) {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> = 0;
      }
      else {
        expected_02._M_str = "eq";
        expected_02._M_len = 2;
        bVar2 = ParseInput::takeKeyword(this,expected_02);
        pRVar3 = (Result<wasm::HeapType> *)CONCAT71(extraout_var_02,bVar2);
        if (bVar2) {
          *(undefined8 *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
            super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
            super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
            super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
            super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> = 3;
        }
        else {
          expected_03._M_str = "i31";
          expected_03._M_len = 3;
          bVar2 = ParseInput::takeKeyword(this,expected_03);
          pRVar3 = (Result<wasm::HeapType> *)CONCAT71(extraout_var_03,bVar2);
          if (bVar2) {
            *(undefined8 *)
             &(__return_storage_ptr__->val).
              super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
              super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
              super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
              super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
              super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> = 4;
          }
          else {
            expected_04._M_str = "struct";
            expected_04._M_len = 6;
            bVar2 = ParseInput::takeKeyword(this,expected_04);
            pRVar3 = (Result<wasm::HeapType> *)CONCAT71(extraout_var_04,bVar2);
            if (bVar2) {
              *(undefined8 *)
               &(__return_storage_ptr__->val).
                super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> = 5;
            }
            else {
              expected_05._M_str = "array";
              expected_05._M_len = 5;
              bVar2 = ParseInput::takeKeyword(this,expected_05);
              pRVar3 = (Result<wasm::HeapType> *)CONCAT71(extraout_var_05,bVar2);
              if (!bVar2) {
                typeidx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                          ((Result<wasm::HeapType> *)local_90,ctx);
                std::__detail::__variant::
                _Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err>::_Copy_ctor_base
                          ((_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_48,
                           (_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_90)
                ;
                if (_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_
                    == '\x01') {
                  type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ =
                       &local_58;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)
                             ((long)&type.val.
                                     super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                     super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                             0x20),local_48,
                             (long)_val.val.
                                   super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>
                                   ._M_u._M_first._M_storage.id + (long)local_48);
                  puVar1 = (undefined8 *)
                           ((long)&(__return_storage_ptr__->val).
                                   super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>
                           + 0x10);
                  *(undefined8 **)
                   &(__return_storage_ptr__->val).
                    super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> = puVar1;
                  if ((undefined8 *)
                      type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ ==
                      &local_58) {
                    *puVar1 = local_58;
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> +
                     0x18) = uStack_50;
                  }
                  else {
                    *(undefined8 *)
                     &(__return_storage_ptr__->val).
                      super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> =
                         type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_;
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> +
                     0x10) = local_58;
                  }
                  *(undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> + 8) =
                       local_60;
                  *(__index_type *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20
                   ) = '\x01';
                  std::__detail::__variant::
                  _Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::~_Variant_storage
                            ((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                             local_48);
                }
                else {
                  std::__detail::__variant::
                  _Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::~_Variant_storage
                            ((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                             local_48);
                  *(undefined1 (*) [8])
                   &(__return_storage_ptr__->val).
                    super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> = local_90;
                  *(__index_type *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20
                   ) = '\0';
                }
                std::__detail::__variant::
                _Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::~_Variant_storage
                          ((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_90
                          );
                return extraout_RAX;
              }
              *(undefined8 *)
               &(__return_storage_ptr__->val).
                super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> = 6;
            }
          }
        }
      }
    }
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20) = '\0';
  return pRVar3;
}

Assistant:

Result<typename Ctx::HeapTypeT> heaptype(Ctx& ctx) {
  if (ctx.in.takeKeyword("func"sv)) {
    return ctx.makeFunc();
  }
  if (ctx.in.takeKeyword("any"sv)) {
    return ctx.makeAny();
  }
  if (ctx.in.takeKeyword("extern"sv)) {
    return ctx.makeExtern();
  }
  if (ctx.in.takeKeyword("eq"sv)) {
    return ctx.makeEq();
  }
  if (ctx.in.takeKeyword("i31"sv)) {
    return ctx.makeI31();
  }
  if (ctx.in.takeKeyword("struct"sv)) {
    return ctx.makeStructType();
  }
  if (ctx.in.takeKeyword("array"sv)) {
    return ctx.makeArrayType();
  }
  auto type = typeidx(ctx);
  CHECK_ERR(type);
  return *type;
}